

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailsOnException::RunImpl
          (TestCheckCloseFailsOnException *this)

{
  TestResults *pTVar1;
  bool bVar2;
  int iVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_8f0 [2];
  TestDetails local_8b0;
  float local_88c;
  float local_888;
  float local_884;
  undefined1 local_880 [8];
  ScopedCurrentTest scopedResults;
  undefined1 local_860 [8];
  TestResults testResults;
  RecordingReporter reporter;
  bool failure;
  TestCheckCloseFailsOnException *this_local;
  
  RecordingReporter::RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_860,(TestReporter *)&testResults.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)local_880,(TestResults *)local_860,(TestDetails *)0x0);
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  iVar3 = ThrowingFunction();
  local_884 = (float)iVar3;
  local_888 = 1.0001;
  local_88c = 0.1;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8b0,*ppTVar5,0xfc);
  UnitTest::CheckClose<float,float,float>(pTVar1,&local_884,&local_888,&local_88c,&local_8b0);
  iVar3 = UnitTest::TestResults::GetFailureCount((TestResults *)local_860);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)local_880);
  RecordingReporter::~RecordingReporter((RecordingReporter *)&testResults.m_failureCount);
  bVar2 = UnitTest::Check<bool>(0 < iVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_8f0,*ppTVar5,0x100);
    UnitTest::TestResults::OnTestFailure(pTVar1,local_8f0,"failure");
  }
  return;
}

Assistant:

TEST(CheckCloseFailsOnException)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE ((float)ThrowingFunction(), 1.0001f, 0.1f);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}